

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O2

void X86_ATT_printInst(MCInst *MI,SStream *OS,void *info)

{
  uint8_t *puVar1;
  char cVar2;
  _Bool _Var3;
  uint uVar4;
  x86_reg xVar5;
  undefined8 in_RAX;
  MCOperand *pMVar6;
  int64_t iVar7;
  MCRegisterClass *c;
  char *s;
  cs_detail *pcVar8;
  long lVar9;
  SStream *O;
  MCRegisterInfo *extraout_RDX;
  MCRegisterInfo *extraout_RDX_00;
  MCRegisterInfo *extraout_RDX_01;
  MCRegisterInfo *extraout_RDX_02;
  MCRegisterInfo *extraout_RDX_03;
  MCRegisterInfo *extraout_RDX_04;
  MCRegisterInfo *extraout_RDX_05;
  MCRegisterInfo *extraout_RDX_06;
  MCRegisterInfo *extraout_RDX_07;
  MCRegisterInfo *extraout_RDX_08;
  MCRegisterInfo *extraout_RDX_09;
  MCRegisterInfo *extraout_RDX_10;
  MCRegisterInfo *extraout_RDX_11;
  MCRegisterInfo *extraout_RDX_12;
  MCRegisterInfo *extraout_RDX_13;
  MCRegisterInfo *MRI;
  MCRegisterInfo *extraout_RDX_14;
  ulong uVar10;
  byte bVar11;
  char *pcVar12;
  char *pcVar13;
  x86_reg reg;
  x86_reg reg2;
  
  _reg = in_RAX;
  if ((MI->csh->mode == CS_MODE_64) && (uVar4 = MCInst_getOpcode(MI), uVar4 == 0x163)) {
    SStream_concat0(OS,"callq\t");
    MCInst_setOpcodePub(MI,0x38);
    printPCRelImm(MI,(uint)OS,O);
    return;
  }
  uVar4 = MCInst_getOpcode(MI);
  if (uVar4 == 0x1879) {
    uVar4 = MCInst_getNumOperands(MI);
    MRI = extraout_RDX_09;
    if (uVar4 == 0) {
      pcVar12 = "xstorerng";
LAB_0014619b:
      s = cs_strdup(pcVar12);
      for (pcVar12 = s; cVar2 = *pcVar12, cVar2 != '\0'; pcVar12 = pcVar12 + 1) {
        if ((cVar2 == ' ') || (cVar2 == '\t')) {
          *pcVar12 = '\0';
          pcVar12 = pcVar12 + 1;
          break;
        }
      }
      SStream_concat0(OS,s);
      MRI = extraout_RDX_10;
      if (*pcVar12 != '\0') {
        SStream_concat0(OS,anon_var_dwarf_70b41 + 0x11);
        MRI = extraout_RDX_11;
        do {
          cVar2 = *pcVar12;
          if (cVar2 == '$') {
            if (pcVar12[1] == -1) {
              pcVar13 = pcVar12 + 3;
              if (pcVar12[3] == '\x01') {
                printf64mem(MI,(int)pcVar12[2] - 1,OS);
                MRI = extraout_RDX_14;
              }
            }
            else {
              pcVar13 = pcVar12 + 1;
              printOperand(MI,(int)pcVar12[1] - 1,OS);
              MRI = extraout_RDX_13;
            }
          }
          else {
            if (cVar2 == '\0') break;
            SStream_concat(OS,"%c",(ulong)(uint)(int)cVar2);
            MRI = extraout_RDX_12;
            pcVar13 = pcVar12;
          }
          pcVar12 = pcVar13 + 1;
        } while( true );
      }
      if (s != (char *)0x0) {
        (*cs_mem_free)(s);
        goto LAB_00146270;
      }
    }
  }
  else if (uVar4 == 0x16) {
    uVar4 = MCInst_getNumOperands(MI);
    MRI = extraout_RDX_03;
    if (uVar4 == 1) {
      pMVar6 = MCInst_getOperand(MI,0);
      _Var3 = MCOperand_isImm(pMVar6);
      MRI = extraout_RDX_04;
      if (_Var3) {
        pMVar6 = MCInst_getOperand(MI,0);
        iVar7 = MCOperand_getImm(pMVar6);
        MRI = extraout_RDX_05;
        if (iVar7 == 10) {
          pcVar12 = "aam";
          goto LAB_0014619b;
        }
      }
    }
  }
  else if (uVar4 == 0x269) {
    uVar4 = MCInst_getNumOperands(MI);
    MRI = extraout_RDX_06;
    if (uVar4 == 6) {
      pMVar6 = MCInst_getOperand(MI,0);
      _Var3 = MCOperand_isReg(pMVar6);
      MRI = extraout_RDX_07;
      if (_Var3) {
        c = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x2a);
        pMVar6 = MCInst_getOperand(MI,0);
        uVar4 = MCOperand_getReg(pMVar6);
        _Var3 = MCRegisterClass_contains(c,uVar4);
        MRI = extraout_RDX_08;
        if (_Var3) {
          pcVar12 = anon_var_dwarf_f6d5;
          goto LAB_0014619b;
        }
      }
    }
  }
  else {
    MRI = extraout_RDX;
    if (uVar4 == 0x15) {
      uVar4 = MCInst_getNumOperands(MI);
      MRI = extraout_RDX_00;
      if (uVar4 == 1) {
        pMVar6 = MCInst_getOperand(MI,0);
        _Var3 = MCOperand_isImm(pMVar6);
        MRI = extraout_RDX_01;
        if (_Var3) {
          pMVar6 = MCInst_getOperand(MI,0);
          iVar7 = MCOperand_getImm(pMVar6);
          MRI = extraout_RDX_02;
          if (iVar7 == 10) {
            pcVar12 = "aad";
            goto LAB_0014619b;
          }
        }
      }
    }
  }
  printInstruction(MI,OS,MRI);
LAB_00146270:
  if (MI->has_imm == true) {
    pcVar8 = MI->flat_insn->detail;
    bVar11 = (pcVar8->field_6).x86.op_count;
    if (bVar11 < 2) {
      *(uint8_t *)((long)&pcVar8->field_6 + 0x50) = MI->imm_size;
    }
    else {
      lVar9 = 0x80;
      for (uVar10 = 0; uVar10 < bVar11; uVar10 = uVar10 + 1) {
        if (*(int *)(pcVar8->regs_read + lVar9 + -0x20) == 2) {
          pcVar8->regs_read[lVar9] = pcVar8->groups[(ulong)(bVar11 - 1) * 0x30 + 0x5e];
          pcVar8 = MI->flat_insn->detail;
          bVar11 = (pcVar8->field_6).x86.op_count;
        }
        lVar9 = lVar9 + 0x30;
      }
    }
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar4 = MCInst_getOpcode(MI);
    xVar5 = X86_insn_reg_att(uVar4);
    _reg = CONCAT44(reg2,xVar5);
    if (xVar5 == X86_REG_INVALID) {
      uVar4 = MCInst_getOpcode(MI);
      _Var3 = X86_insn_reg_att2(uVar4,&reg,&reg2);
      if (_Var3) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = reg;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) =
             MI->csh->regsize_map[_reg & 0xffffffff];
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = reg2;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) = MI->csh->regsize_map[reg2];
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar8 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar8->field_6 + 0x60),(void *)((long)&pcVar8->field_6 + 0x30),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar5;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[xVar5];
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

void X86_ATT_printInst(MCInst *MI, SStream *OS, void *info)
{
	char *mnem;
	x86_reg reg, reg2;
	int i;

	// Output CALLpcrel32 as "callq" in 64-bit mode.
	// In Intel annotation it's always emitted as "call".
	//
	// TODO: Probably this hack should be redesigned via InstAlias in
	// InstrInfo.td as soon as Requires clause is supported properly
	// for InstAlias.
	if (MI->csh->mode == CS_MODE_64 && MCInst_getOpcode(MI) == X86_CALLpcrel32) {
		SStream_concat0(OS, "callq\t");
		MCInst_setOpcodePub(MI, X86_INS_CALL);
		printPCRelImm(MI, 0, OS);
		return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, OS, info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, OS, info);

	if (MI->has_imm) {
		// if op_count > 1, then this operand's size is taken from the destination op
		if (MI->flat_insn->detail->x86.op_count > 1) {
			for (i = 0; i < MI->flat_insn->detail->x86.op_count; i++) {
				if (MI->flat_insn->detail->x86.operands[i].type == X86_OP_IMM)
					MI->flat_insn->detail->x86.operands[i].size = MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count - 1].size;
			}
		} else
			MI->flat_insn->detail->x86.operands[0].size = MI->imm_size;
	}

	if (MI->csh->detail) {
		// special instruction needs to supply register op
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		reg = X86_insn_reg_att(MCInst_getOpcode(MI));
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_att2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}
}